

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O1

void Llb_MtrFree(Llb_Mtr_t *p)

{
  long lVar1;
  
  if (p->pProdVars != (char *)0x0) {
    free(p->pProdVars);
    p->pProdVars = (char *)0x0;
  }
  if (p->pProdNums != (int *)0x0) {
    free(p->pProdNums);
    p->pProdNums = (int *)0x0;
  }
  if (0 < p->nCols) {
    lVar1 = 0;
    do {
      if (p->pMatrix[lVar1] != (char *)0x0) {
        free(p->pMatrix[lVar1]);
        p->pMatrix[lVar1] = (char *)0x0;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nCols);
  }
  if (p->pRowSums != (int *)0x0) {
    free(p->pRowSums);
    p->pRowSums = (int *)0x0;
  }
  if (p->pColSums != (int *)0x0) {
    free(p->pColSums);
    p->pColSums = (int *)0x0;
  }
  if (p->pMatrix != (char **)0x0) {
    free(p->pMatrix);
    p->pMatrix = (char **)0x0;
  }
  if (p->pColGrps != (Llb_Grp_t **)0x0) {
    free(p->pColGrps);
    p->pColGrps = (Llb_Grp_t **)0x0;
  }
  if (p != (Llb_Mtr_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Llb_MtrFree( Llb_Mtr_t * p )
{
    int i;
    ABC_FREE( p->pProdVars );
    ABC_FREE( p->pProdNums );
    for ( i = 0; i < p->nCols; i++ )
        ABC_FREE( p->pMatrix[i] );
    ABC_FREE( p->pRowSums );
    ABC_FREE( p->pColSums );
    ABC_FREE( p->pMatrix );
    ABC_FREE( p->pColGrps );
    ABC_FREE( p );
}